

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::EnterFrame(SQVM *this,SQInteger newbase,SQInteger newtop,bool tailcall)

{
  SQInt32 *pSVar1;
  int iVar2;
  CallInfo *pCVar3;
  long lVar4;
  undefined7 in_register_00000009;
  bool bVar5;
  SQObjectPtr local_30;
  
  if ((int)CONCAT71(in_register_00000009,tailcall) == 0) {
    lVar4 = this->_callsstacksize;
    if (lVar4 == this->_alloccallsstacksize) {
      GrowCallStack(this);
      lVar4 = this->_callsstacksize;
    }
    pCVar3 = this->_callsstack;
    this->_callsstacksize = lVar4 + 1;
    this->ci = pCVar3 + lVar4;
    iVar2 = (int)this->_stackbase;
    pCVar3[lVar4]._prevstkbase = (int)newbase - iVar2;
    pCVar3[lVar4]._prevtop = (int)this->_top - iVar2;
    pCVar3[lVar4]._etraps = 0;
    pCVar3[lVar4]._ncalls = 1;
    pCVar3[lVar4]._generator = (SQGenerator *)0x0;
    pCVar3[lVar4]._root = 0;
  }
  else {
    pSVar1 = &this->ci->_ncalls;
    *pSVar1 = *pSVar1 + 1;
  }
  this->_stackbase = newbase;
  this->_top = newtop;
  bVar5 = true;
  if ((long)(this->_stack)._size < newtop + 0xf) {
    if (this->_nmetamethodscall == 0) {
      local_30.super_SQObject._type = OT_NULL;
      local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
      sqvector<SQObjectPtr>::resize(&this->_stack,newtop + 0x3c,&local_30);
      SQObjectPtr::~SQObjectPtr(&local_30);
      RelocateOuters(this);
    }
    else {
      bVar5 = false;
      Raise_Error(this,"stack overflow, cannot resize stack while in a metamethod");
    }
  }
  return bVar5;
}

Assistant:

bool SQVM::EnterFrame(SQInteger newbase, SQInteger newtop, bool tailcall)
{
    if( !tailcall ) {
        if( _callsstacksize == _alloccallsstacksize ) {
            GrowCallStack();
        }
        ci = &_callsstack[_callsstacksize++];
        ci->_prevstkbase = (SQInt32)(newbase - _stackbase);
        ci->_prevtop = (SQInt32)(_top - _stackbase);
        ci->_etraps = 0;
        ci->_ncalls = 1;
        ci->_generator = NULL;
        ci->_root = SQFalse;
    }
    else {
        ci->_ncalls++;
    }

    _stackbase = newbase;
    _top = newtop;
    if(newtop + MIN_STACK_OVERHEAD > (SQInteger)_stack.size()) {
        if(_nmetamethodscall) {
            Raise_Error(_SC("stack overflow, cannot resize stack while in a metamethod"));
            return false;
        }
        _stack.resize(newtop + (MIN_STACK_OVERHEAD << 2));
        RelocateOuters();
    }
    return true;
}